

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>
mp::internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>(Impl *impl)

{
  ExprBase in_RDI;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> expr;
  
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x19b8b3);
  return (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)(ExprBase)in_RDI.impl_;
}

Assistant:

static TargetExpr Create(const ExprBase::Impl *impl) {
    MP_ASSERT((!impl || internal::Is<TargetExpr>(impl->kind())),
              "invalid expression kind");
    TargetExpr expr;
    expr.impl_ = impl;
    return expr;
  }